

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

c_int osqp_update_A(OSQPWorkspace *work,c_float *Ax_new,c_int *Ax_new_idx,c_int A_new_n)

{
  csc *pcVar1;
  ulong uVar2;
  c_float *pcVar3;
  long lVar4;
  ulong uVar5;
  c_int cVar6;
  c_float cVar7;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar6 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_A");
    return cVar6;
  }
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer);
  pcVar1 = work->data->A;
  uVar2 = pcVar1->p[pcVar1->n];
  if ((Ax_new_idx == (c_int *)0x0) || (A_new_n <= (long)uVar2)) {
    if (work->settings->scaling != 0) {
      unscale_data(work);
    }
    if (Ax_new_idx == (c_int *)0x0) {
      if (0 < (long)uVar2) {
        pcVar3 = work->data->A->x;
        uVar5 = 0;
        do {
          pcVar3[uVar5] = Ax_new[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    else if (0 < A_new_n) {
      pcVar3 = work->data->A->x;
      lVar4 = 0;
      do {
        pcVar3[Ax_new_idx[lVar4]] = Ax_new[lVar4];
        lVar4 = lVar4 + 1;
      } while (A_new_n != lVar4);
    }
    if (work->settings->scaling != 0) {
      scale_data(work);
    }
    cVar6 = (*work->linsys_solver->update_matrices)(work->linsys_solver,work->data->P,work->data->A)
    ;
    reset_info(work->info);
    if (cVar6 < 0) {
      printf("ERROR in %s: ","osqp_update_A");
      printf("new KKT matrix is not quasidefinite");
      putchar(10);
    }
    cVar7 = osqp_toc(work->timer);
    work->info->update_time = cVar7 + work->info->update_time;
  }
  else {
    printf("ERROR in %s: ","osqp_update_A");
    printf("new number of elements (%i) greater than elements in A (%i)",A_new_n & 0xffffffff,
           uVar2 & 0xffffffff);
    putchar(10);
    cVar6 = 1;
  }
  return cVar6;
}

Assistant:

c_int osqp_update_A(OSQPWorkspace *work,
                    const c_float *Ax_new,
                    const c_int   *Ax_new_idx,
                    c_int          A_new_n) {
  c_int i;        // For indexing
  c_int exitflag; // Exit flag
  c_int nnzA;     // Number of nonzeros in A

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  nnzA = work->data->A->p[work->data->A->n];

  if (Ax_new_idx) { // Passing the index of elements changed
    // Check if number of elements is less or equal than the total number of
    // nonzeros in A
    if (A_new_n > nnzA) {
# ifdef PRINTING
      c_eprint("new number of elements (%i) greater than elements in A (%i)",
               (int)A_new_n,
               (int)nnzA);
# endif /* ifdef PRINTING */
      return 1;
    }
  }

  if (work->settings->scaling) {
    // Unscale data
    unscale_data(work);
  }

  // Update A elements
  if (Ax_new_idx) { // Change only Ax_new_idx
    for (i = 0; i < A_new_n; i++) {
      work->data->A->x[Ax_new_idx[i]] = Ax_new[i];
    }
  }
  else { // Change whole A
    for (i = 0; i < nnzA; i++) {
      work->data->A->x[i] = Ax_new[i];
    }
  }

  if (work->settings->scaling) {
    // Scale data
    scale_data(work);
  }

  // Update linear system structure with new data
  exitflag = work->linsys_solver->update_matrices(work->linsys_solver,
                                                  work->data->P,
                                                  work->data->A);

  // Reset solver information
  reset_info(work->info);

# ifdef PRINTING

  if (exitflag < 0) {
    c_eprint("new KKT matrix is not quasidefinite");
  }
# endif /* ifdef PRINTING */

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}